

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

bool LLVMBC::Instruction::is_base_of_value_kind(ValueKind kind)

{
  bool local_9;
  ValueKind kind_local;
  
  if (((kind - UnaryOperator < 6) || (kind - PHI < 0xe)) || (kind - ShuffleVector < 3)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool Instruction::is_base_of_value_kind(ValueKind kind)
{
	switch (kind)
	{
	case ValueKind::Return:
	case ValueKind::Unreachable:
	case ValueKind::Call:
	case ValueKind::UnaryOperator:
	case ValueKind::BinaryOperator:
	case ValueKind::Cast:
	case ValueKind::Select:
	case ValueKind::ExtractValue:
	case ValueKind::Alloca:
	case ValueKind::GetElementPtr:
	case ValueKind::Load:
	case ValueKind::Store:
	case ValueKind::CompareBase:
	case ValueKind::FCmp:
	case ValueKind::ICmp:
	case ValueKind::Branch:
	case ValueKind::Switch:
	case ValueKind::PHI:
	case ValueKind::AtomicRMW:
	case ValueKind::AtomicCmpXchg:
	case ValueKind::ShuffleVector:
	case ValueKind::ExtractElement:
	case ValueKind::InsertElement:
		return true;

	default:
		break;
	}

	return false;
}